

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceNSC.cpp
# Opt level: O3

void __thiscall chrono::ChMaterialCompositeNSC::ChMaterialCompositeNSC(ChMaterialCompositeNSC *this)

{
  (this->super_ChMaterialComposite)._vptr_ChMaterialComposite =
       (_func_int **)&PTR__ChMaterialComposite_00b15a10;
  this->static_friction = 0.0;
  this->sliding_friction = 0.0;
  this->rolling_friction = 0.0;
  this->spinning_friction = 0.0;
  this->restitution = 0.0;
  this->cohesion = 0.0;
  this->dampingf = 0.0;
  this->compliance = 0.0;
  this->spinning_friction = 0.0;
  this->restitution = 0.0;
  this->cohesion = 0.0;
  this->dampingf = 0.0;
  this->compliance = 0.0;
  this->complianceT = 0.0;
  this->complianceRoll = 0.0;
  this->complianceSpin = 0.0;
  return;
}

Assistant:

ChMaterialCompositeNSC::ChMaterialCompositeNSC()
    : static_friction(0),
      sliding_friction(0),
      rolling_friction(0),
      spinning_friction(0),
      restitution(0),
      cohesion(0),
      dampingf(0),
      compliance(0),
      complianceT(0),
      complianceRoll(0),
      complianceSpin(0) {}